

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDVertex::ClearEdgeMarks(ON_SubDVertex *this)

{
  ulong uVar1;
  ON_SubDEdge *e;
  unsigned_short vei;
  bool rc;
  ON_SubDVertex *this_local;
  
  e._7_1_ = true;
  for (e._4_2_ = 0; e._4_2_ < this->m_edge_count; e._4_2_ = e._4_2_ + 1) {
    uVar1 = this->m_edges[e._4_2_].m_ptr & 0xfffffffffffffff8;
    if (uVar1 == 0) {
      e._7_1_ = false;
    }
    else {
      ON_ComponentStatus::ClearRuntimeMark((ON_ComponentStatus *)(uVar1 + 0x10));
    }
  }
  return e._7_1_;
}

Assistant:

bool ON_SubDVertex::ClearEdgeMarks() const
{
  bool rc = true;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
      rc = false;
    else
      e->m_status.ClearRuntimeMark();
  }
  return rc;
}